

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void __thiscall embree::SceneGraph::MultiTransformNode::calculateInDegree(MultiTransformNode *this)

{
  size_t sVar1;
  pointer pTVar2;
  long lVar3;
  ulong uVar4;
  
  sVar1 = (this->super_Node).indegree;
  (this->super_Node).indegree = sVar1 + 1;
  if (sVar1 != 0) {
    return;
  }
  (*(((this->child).ptr)->super_RefCount)._vptr_RefCount[6])();
  pTVar2 = (this->spaces).
           super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->spaces).
      super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
      ._M_impl.super__Vector_impl_data._M_finish != pTVar2) {
    lVar3 = 0x10;
    uVar4 = 0;
    do {
      if (1 < *(ulong *)((long)&(pTVar2->time_range).lower + lVar3)) {
        (*(((this->child).ptr)->super_RefCount)._vptr_RefCount[6])();
      }
      uVar4 = uVar4 + 1;
      pTVar2 = (this->spaces).
               super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = lVar3 + 0x30;
    } while (uVar4 < (ulong)(((long)(this->spaces).
                                    super__Vector_base<embree::SceneGraph::Transformations,_std::allocator<embree::SceneGraph::Transformations>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void SceneGraph::MultiTransformNode::calculateInDegree()
  {
    indegree++;
    if (indegree == 1) {
      child->calculateInDegree();
      for (size_t i = 0; i < spaces.size(); ++i)
        if (spaces[i].size() > 1) child->calculateInDegree(); // break instance up when motion blur is used
    }
  }